

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionScreen::Drawer(DIntermissionScreen *this)

{
  uint uVar1;
  FIIntermissionPatch *pFVar2;
  bool bVar3;
  undefined8 in_RAX;
  long lVar4;
  FTexture *pFVar5;
  uint i;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = (this->mBackground).texnum;
  lVar4 = (long)(int)uVar1;
  uVar7 = (uint)((ulong)in_RAX >> 0x20);
  if (lVar4 < 1) {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height,0,
               (ulong)uVar7 << 0x20);
  }
  else if (this->mFlatfill == false) {
    if (uVar1 < TexMan.Textures.Count) {
      pFVar5 = TexMan.Textures.Array[lVar4].Texture;
    }
    else {
      pFVar5 = (FTexture *)0x0;
    }
    DCanvas::DrawTexture((DCanvas *)screen,pFVar5,0.0,0.0,0x400013ae,1,0);
  }
  else {
    if (uVar1 < TexMan.Textures.Count) {
      pFVar5 = TexMan.Textures.Array[lVar4].Texture;
    }
    else {
      pFVar5 = (FTexture *)0x0;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
              (screen,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height,pFVar5,
               (ulong)uVar7 << 0x20);
  }
  lVar4 = 0x10;
  for (uVar6 = 0; uVar6 < (this->mOverlays).Count; uVar6 = uVar6 + 1) {
    bVar3 = CheckOverlay(this,(int)uVar6);
    if (bVar3) {
      pFVar2 = (this->mOverlays).Array;
      uVar1 = *(uint *)((long)pFVar2 + lVar4 + -0xc);
      if (uVar1 < TexMan.Textures.Count) {
        pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
      }
      else {
        pFVar5 = (FTexture *)0x0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar5,*(double *)((long)pFVar2 + lVar4 + -8),
                 *(double *)((long)&(pFVar2->mCondition).Index + lVar4),0x40001391,1,0);
    }
    lVar4 = lVar4 + 0x18;
  }
  if (this->mFlatfill != false) {
    return;
  }
  DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  return;
}

Assistant:

void DIntermissionScreen::Drawer ()
{
	if (mBackground.isValid())
	{
		if (!mFlatfill)
		{
			screen->DrawTexture (TexMan[mBackground], 0, 0, DTA_Fullscreen, true, TAG_DONE);
		}
		else
		{
			screen->FlatFill (0,0, SCREENWIDTH, SCREENHEIGHT, TexMan[mBackground]);
		}
	}
	else
	{
		screen->Clear (0, 0, SCREENWIDTH, SCREENHEIGHT, 0, 0);
	}
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		if (CheckOverlay(i))
			screen->DrawTexture (TexMan[mOverlays[i].mPic], mOverlays[i].x, mOverlays[i].y, DTA_320x200, true, TAG_DONE);
	}
	if (!mFlatfill) screen->FillBorder (NULL);
}